

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_dce.c
# Opt level: O0

void dce_marksnap(jit_State *J)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  SnapEntry *pSVar4;
  IRIns *pIVar5;
  uint uVar6;
  SnapShot *pSVar7;
  IRRef ref;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  SnapNo nsnap;
  SnapNo i;
  jit_State *J_local;
  
  uVar2 = (J->cur).nsnap;
  for (i = 0; i < uVar2; i = i + 1) {
    pSVar7 = (J->cur).snap + i;
    pSVar4 = (J->cur).snapmap;
    uVar3 = pSVar7->mapofs;
    bVar1 = pSVar7->nent;
    for (n = 0; n < bVar1; n = n + 1) {
      uVar6 = pSVar4[(ulong)uVar3 + (ulong)n] & 0xffff;
      if (0x8000 < uVar6) {
        pIVar5 = (J->cur).ir;
        *(byte *)((long)pIVar5 + (ulong)uVar6 * 8 + 4) =
             *(byte *)((long)pIVar5 + (ulong)uVar6 * 8 + 4) | 0x20;
      }
    }
  }
  return;
}

Assistant:

static void dce_marksnap(jit_State *J)
{
  SnapNo i, nsnap = J->cur.nsnap;
  for (i = 0; i < nsnap; i++) {
    SnapShot *snap = &J->cur.snap[i];
    SnapEntry *map = &J->cur.snapmap[snap->mapofs];
    MSize n, nent = snap->nent;
    for (n = 0; n < nent; n++) {
      IRRef ref = snap_ref(map[n]);
      if (ref >= REF_FIRST)
	irt_setmark(IR(ref)->t);
    }
  }
}